

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool adios2sys::SystemTools::FileExists(char *filename)

{
  char *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [47];
  byte local_1;
  
  if (in_RDI == (char *)0x0) {
    local_1 = 0;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,in_RDI,&local_31);
    local_1 = FileExists(in_stack_ffffffffffffff98);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SystemTools::FileExists(const char* filename)
{
  if (!filename) {
    return false;
  }
  return SystemTools::FileExists(std::string(filename));
}